

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  RunContext *this_00;
  IResultCapture *in_RDI;
  TestRunInfo *_runInfo;
  TestRunStats *this_01;
  undefined1 local_70 [112];
  
  in_RDI->_vptr_IResultCapture = (_func_int **)&PTR__RunContext_00277ac0;
  in_RDI[1]._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00277b80;
  this_00 = (RunContext *)
            clara::std::
            unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
            operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)0x12870c);
  _runInfo = (TestRunInfo *)(in_RDI + 2);
  this_01 = (TestRunStats *)(in_RDI + 0x1e);
  aborting(this_00);
  TestRunStats::TestRunStats(this_01,_runInfo,(Totals *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
  (*(this_00->super_IResultCapture)._vptr_IResultCapture[0xe])(this_00,local_70);
  TestRunStats::~TestRunStats((TestRunStats *)0x128779);
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)this_00);
  TestCaseTracking::TrackerContext::~TrackerContext((TrackerContext *)0x128799);
  clara::std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
             *)this_01);
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)this_01);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)this_01);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_01);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::~unique_ptr((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                 *)this_00);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)0x1287f9);
  Option<Catch::AssertionResult>::~Option((Option<Catch::AssertionResult> *)0x128806);
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x128813);
  IRunner::~IRunner((IRunner *)(in_RDI + 1));
  IResultCapture::~IResultCapture(in_RDI);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }